

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O1

void Ifn_NtkMatchCollectConfig(Ifn_Ntk_t *p,sat_solver *pSat,word *pConfig)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  if (p->nParsVNum < 5) {
    if (0 < p->nInps) {
      uVar5 = 0;
      do {
        iVar1 = p->nParsVNum;
        if (iVar1 < 1) {
          lVar2 = 0;
        }
        else {
          uVar6 = 0;
          iVar4 = 0;
          do {
            iVar1 = sat_solver_var_value(pSat,iVar1 * uVar5 + p->nParsVIni + iVar4);
            uVar3 = 1 << ((byte)iVar4 & 0x1f);
            if (iVar1 == 0) {
              uVar3 = 0;
            }
            uVar6 = uVar6 | uVar3;
            iVar4 = iVar4 + 1;
            iVar1 = p->nParsVNum;
          } while (iVar4 < iVar1);
          lVar2 = (long)(int)uVar6;
        }
        pConfig[uVar5 >> 4] = pConfig[uVar5 >> 4] | lVar2 << ((char)uVar5 * '\x04' & 0x3fU);
        uVar5 = uVar5 + 1;
      } while ((int)uVar5 < p->nInps);
    }
    for (iVar1 = p->nObjs; iVar1 < p->nParsVIni; iVar1 = iVar1 + 1) {
      iVar4 = sat_solver_var_value(pSat,iVar1);
      if (iVar4 != 0) {
        iVar4 = iVar1 - p->nObjs;
        pConfig[(long)(iVar4 >> 6) + 1] =
             pConfig[(long)(iVar4 >> 6) + 1] | 1L << ((byte)iVar4 & 0x3f);
      }
    }
    return;
  }
  __assert_fail("p->nParsVNum <= 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                ,0x51c,"void Ifn_NtkMatchCollectConfig(Ifn_Ntk_t *, sat_solver *, word *)");
}

Assistant:

void Ifn_NtkMatchCollectConfig( Ifn_Ntk_t * p, sat_solver * pSat, word * pConfig )
{
    int i, v, Mint;
    assert( p->nParsVNum <= 4 );
    for ( i = 0; i < p->nInps; i++ )
    {
        for ( Mint = v = 0; v < p->nParsVNum; v++ )
            if ( sat_solver_var_value(pSat, p->nParsVIni + i * p->nParsVNum + v) )
                Mint |= (1 << v);
        Abc_TtSetHex( pConfig, i, Mint );
    }
    for ( v = p->nObjs; v < p->nParsVIni; v++ )
        if ( sat_solver_var_value(pSat, v) )
            Abc_TtSetBit( pConfig + 1, v - p->nObjs );
}